

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O1

bool __thiscall
QSqlRelationalTableModel::removeColumns
          (QSqlRelationalTableModel *this,int column,int count,QModelIndex *parent)

{
  QArrayDataPointer<QSharedPointer<QRelation>_> *this_00;
  long lVar1;
  int iVar2;
  char *__filename;
  bool bVar3;
  
  __filename = (char *)(ulong)(uint)column;
  bVar3 = false;
  if ((-1 < parent->r) && (bVar3 = false, -1 < parent->c)) {
    bVar3 = (parent->m).ptr != (QAbstractItemModel *)0x0;
  }
  if ((-1 < column) && (!bVar3)) {
    lVar1 = *(long *)(this + 8);
    iVar2 = QSqlRecord::count((QSqlRecord *)(lVar1 + 0x100));
    if (column + count <= iVar2) {
      if (0 < count) {
        this_00 = (QArrayDataPointer<QSharedPointer<QRelation>_> *)(lVar1 + 0x2e8);
        iVar2 = count;
        do {
          QSqlRecord::remove((QSqlRecord *)(lVar1 + 0x300),__filename);
          if (__filename < *(char **)(lVar1 + 0x2f8)) {
            if ((this_00->d == (Data *)0x0) ||
               (1 < (this_00->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
              QArrayDataPointer<QSharedPointer<QRelation>_>::reallocateAndGrow
                        (this_00,GrowsAtEnd,0,(QArrayDataPointer<QSharedPointer<QRelation>_> *)0x0);
            }
            QtPrivate::QMovableArrayOps<QSharedPointer<QRelation>_>::erase
                      ((QMovableArrayOps<QSharedPointer<QRelation>_> *)this_00,
                       (QSharedPointer<QRelation> *)
                       (*(long *)(lVar1 + 0x2f0) + (long)__filename * 0x10),1);
          }
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
      bVar3 = QSqlTableModel::removeColumns((QSqlTableModel *)this,column,count,parent);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool QSqlRelationalTableModel::removeColumns(int column, int count, const QModelIndex &parent)
{
    Q_D(QSqlRelationalTableModel);

    if (parent.isValid() || column < 0 || column + count > d->rec.count())
        return false;

    for (int i = 0; i < count; ++i) {
        d->baseRec.remove(column);
        if (d->relations.size() > column)
            d->relations.remove(column);
    }
    return QSqlTableModel::removeColumns(column, count, parent);
}